

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tufted_laplacian.cpp
# Opt level: O3

void geometrycentral::surface::buildIntrinsicTuftedCover
               (SurfaceMesh *mesh,EdgeData<double> *edgeLengths,EmbeddedGeometryInterface *posGeom)

{
  size_t sVar1;
  unsigned_long uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  iterator __last;
  EdgeData<double> *pEVar8;
  byte bVar9;
  uint uVar10;
  size_t i_3;
  ParentMeshT *pPVar11;
  bool *pbVar12;
  pointer puVar13;
  ulong uVar14;
  size_t i;
  unsigned_long uVar15;
  Vector3 *pVVar16;
  ParentMeshT *pPVar17;
  size_t sVar18;
  pointer puVar19;
  size_t i_5;
  size_t sVar20;
  ParentMeshT *pPVar21;
  pointer puVar22;
  uint uVar23;
  ulong uVar24;
  size_t i_1;
  size_t sVar25;
  double dVar26;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  __i;
  double dVar27;
  long lVar28;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  __last_00;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  Halfedge heA;
  Halfedge heB;
  Face FVar51;
  Edge EVar52;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  edgeFaces;
  Vector3 pTail;
  Halfedge he;
  anon_class_24_3_ca2f44c0 edgeAngle;
  HalfedgeData<Halfedge> otherSheet;
  FaceData<bool> isFront;
  EdgeData<bool> isOrigEdge;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  local_188;
  iterator iStack_180;
  Halfedge *local_178;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  local_168;
  EmbeddedGeometryInterface *local_160;
  double local_158;
  double dStack_150;
  double local_148;
  size_t local_138;
  EdgeData<double> *local_130;
  Halfedge local_128;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  EmbeddedGeometryInterface **local_f8;
  double *local_f0;
  Halfedge *local_e8;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge> local_e0;
  MeshData<geometrycentral::surface::Face,_bool> local_a0;
  MeshData<geometrycentral::surface::Edge,_bool> local_68;
  
  local_160 = posGeom;
  if (posGeom != (EmbeddedGeometryInterface *)0x0) {
    EmbeddedGeometryInterface::requireVertexPositions(posGeom);
    EmbeddedGeometryInterface::requireFaceNormals(posGeom);
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::MeshData
            (&local_e0,mesh);
  MeshData<geometrycentral::surface::Face,_bool>::MeshData(&local_a0,mesh,true);
  sVar18 = mesh->nFacesFillCount;
  local_130 = edgeLengths;
  if ((sVar18 == 0) ||
     (puVar13 = (mesh->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar13 != 0xffffffffffffffff)) {
    sVar25 = 0;
  }
  else {
    sVar25 = 0;
    do {
      if (sVar18 - 1 == sVar25) goto LAB_001aa08c;
      lVar28 = sVar25 + 1;
      sVar25 = sVar25 + 1;
    } while (puVar13[lVar28] == 0xffffffffffffffff);
  }
  if (sVar25 != sVar18) {
    pbVar12 = local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    do {
      if (pbVar12[sVar25] == true) {
        FVar51.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        ind = sVar25;
        FVar51.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        mesh = mesh;
        FVar51 = SurfaceMesh::duplicateFace(mesh,FVar51);
        pPVar11 = FVar51.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        puVar13 = (pPVar11->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  FVar51.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .ind;
        uVar15 = (mesh->fHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar25];
        do {
          uVar2 = *puVar13;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar15].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = pPVar11;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar15].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = uVar2;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar2].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = mesh;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar2].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = uVar15;
          puVar13 = (pPVar11->heNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar2;
          uVar15 = (mesh->heNextArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15];
        } while (uVar15 != (mesh->fHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[sVar25]);
        SurfaceMesh::invertOrientation(mesh,FVar51);
        local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [FVar51.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
         .ind] = false;
        pbVar12 = local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
      }
      do {
        if (sVar18 - 1 == sVar25) goto LAB_001aa08c;
        lVar28 = sVar25 + 1;
        sVar25 = sVar25 + 1;
      } while ((mesh->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar28] == 0xffffffffffffffff);
    } while (sVar18 != sVar25);
  }
LAB_001aa08c:
  MeshData<geometrycentral::surface::Edge,_bool>::MeshData(&local_68,mesh,true);
  sVar18 = mesh->nEdgesFillCount;
  if (sVar18 != 0) {
    puVar13 = (mesh->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar19 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar22 = puVar13;
    if (mesh->useImplicitTwinFlag != false) {
      puVar22 = puVar19;
    }
    if (*puVar22 == 0xffffffffffffffff) {
      sVar25 = 0;
      do {
        puVar13 = puVar13 + 1;
        puVar19 = puVar19 + 2;
        if (sVar18 - 1 == sVar25) goto LAB_001aa0e1;
        puVar22 = puVar13;
        if (mesh->useImplicitTwinFlag != false) {
          puVar22 = puVar19;
        }
        sVar25 = sVar25 + 1;
      } while (*puVar22 == 0xffffffffffffffff);
      goto LAB_001aa0d8;
    }
  }
  sVar25 = 0;
LAB_001aa0d8:
  if (sVar25 != sVar18) {
    bVar9 = mesh->useImplicitTwinFlag;
    sVar1 = sVar18 - 1;
    do {
      if (local_68.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[sVar25] == true) {
        local_178 = (Halfedge *)0x0;
        local_188._M_current = (Halfedge *)0x0;
        iStack_180._M_current = (Halfedge *)0x0;
        local_138 = sVar18;
        if ((bVar9 & 1) == 0) {
          dVar26 = (double)(mesh->eHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[sVar25];
          dVar27 = dVar26;
        }
        else {
          dVar26 = (double)(sVar25 * 2);
          dVar27 = dVar26;
        }
        do {
          local_128.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = mesh;
          local_128.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = (size_t)dVar26;
          if (local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[(mesh->heFaceArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar26]] == true) {
            if (iStack_180._M_current == local_178) {
              ::std::
              vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>
              ::_M_realloc_insert<geometrycentral::surface::Halfedge_const&>
                        ((vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>
                          *)&local_188,iStack_180,&local_128);
            }
            else {
              ((iStack_180._M_current)->
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              ).mesh = mesh;
              ((iStack_180._M_current)->
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              ).ind = (size_t)dVar26;
              iStack_180._M_current = iStack_180._M_current + 1;
            }
          }
          __last._M_current = (Halfedge *)iStack_180;
          if (mesh->useImplicitTwinFlag == true) {
            dVar26 = (double)((ulong)dVar26 ^ 1);
          }
          else {
            dVar26 = (double)(mesh->heSiblingArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[(long)dVar26];
          }
        } while (dVar26 != dVar27);
        if (local_160 != (EmbeddedGeometryInterface *)0x0) {
          if (mesh->useImplicitTwinFlag == false) {
            puVar13 = (mesh->heVertexArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pVVar16 = (local_160->vertexPositions).data.
                      super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>
                      .m_storage.m_data;
            local_148 = pVVar16[puVar13[(mesh->eHalfedgeArr).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start[sVar25]]].z;
            local_158 = pVVar16[puVar13[(mesh->eHalfedgeArr).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start[sVar25]]].x;
            dStack_150 = pVVar16[puVar13[(mesh->eHalfedgeArr).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start[sVar25]]].y;
            uVar15 = (mesh->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar25];
          }
          else {
            puVar13 = (mesh->heVertexArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pVVar16 = (local_160->vertexPositions).data.
                      super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>
                      .m_storage.m_data;
            local_148 = pVVar16[puVar13[sVar25 * 2]].z;
            local_158 = pVVar16[puVar13[sVar25 * 2]].x;
            dStack_150 = pVVar16[puVar13[sVar25 * 2]].y;
            uVar15 = sVar25 * 2;
          }
          auVar4._0_8_ = pVVar16[puVar13[(mesh->heNextArr).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar15]]].x;
          auVar4._8_8_ = pVVar16[puVar13[(mesh->heNextArr).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar15]]].y;
          auVar30._8_8_ = dStack_150;
          auVar30._0_8_ = local_158;
          auVar30 = vsubpd_avx(auVar4,auVar30);
          dVar5 = pVVar16[puVar13[(mesh->heNextArr).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15]]].z - local_148;
          dVar26 = auVar30._0_8_;
          auVar40._0_8_ = dVar26 * dVar26;
          dVar27 = auVar30._8_8_;
          auVar40._8_8_ = dVar27 * dVar27;
          auVar4 = vshufpd_avx(auVar40,auVar40,1);
          auVar4 = vfmadd231sd_fma(auVar4,auVar30,auVar30);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = dVar5;
          auVar4 = vfmadd231sd_fma(auVar4,auVar33,auVar33);
          auVar4 = vsqrtsd_avx(auVar4,auVar4);
          dVar39 = 1.0 / auVar4._0_8_;
          dVar5 = dVar5 * dVar39;
          auVar37._0_8_ = dVar26 * dVar39;
          auVar37._8_8_ = dVar27 * dVar39;
          auVar4 = vshufpd_avx(auVar37,auVar37,1);
          dVar39 = auVar4._0_8_;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar5;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = auVar37._0_8_ + dVar39 * 0.0;
          auVar30 = vfmadd231sd_fma(auVar41,auVar34,ZEXT816(0) << 0x40);
          auVar6._8_8_ = 0x7fffffffffffffff;
          auVar6._0_8_ = 0x7fffffffffffffff;
          auVar30 = vandpd_avx512vl(auVar30,auVar6);
          bVar7 = 0.9 < auVar30._0_8_;
          local_f8 = &local_160;
          dVar27 = (double)((ulong)!bVar7 * 0x3ff0000000000000);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar27;
          dVar26 = (double)((ulong)bVar7 * 0x3ff0000000000000);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar26;
          local_f0 = &local_158;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = dVar39 * -0.0;
          auVar6 = vfmadd231sd_fma(auVar46,auVar32,auVar34);
          local_e8 = &local_128;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar5 * dVar27;
          auVar30 = vfmsub231sd_fma(auVar48,auVar37,ZEXT816(0) << 0x40);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = auVar37._0_8_ * dVar26;
          auVar31 = vfmsub231sd_fma(auVar44,auVar4,auVar31);
          local_128.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = auVar30._0_8_;
          auVar42._8_8_ = 0;
          auVar42._0_8_ =
               (double)local_128.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind *
               (double)local_128.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind;
          auVar30 = vfmadd231sd_fma(auVar42,auVar6,auVar6);
          auVar30 = vfmadd231sd_fma(auVar30,auVar31,auVar31);
          auVar30 = vsqrtsd_avx(auVar30,auVar30);
          local_118 = 1.0 / auVar30._0_8_;
          local_128.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = (ParentMeshT *)(auVar6._0_8_ * local_118);
          local_128.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = (size_t)((double)local_128.
                                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                 .ind * local_118);
          local_118 = auVar31._0_8_ * local_118;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar5;
          auVar47._8_8_ = 0;
          auVar47._0_8_ =
               local_128.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_118 * auVar37._0_8_;
          auVar30 = vfmsub231sd_fma(auVar50,auVar47,auVar35);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = local_118;
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               (double)local_128.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind * dVar5;
          auVar6 = vfmsub231sd_fma(auVar45,auVar4,auVar43);
          auVar36._8_8_ = 0;
          auVar36._0_8_ =
               (double)local_128.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .mesh * dVar39;
          auVar49._8_8_ = 0;
          auVar49._0_8_ =
               local_128.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind;
          auVar31 = vfmsub231sd_fma(auVar36,auVar49,auVar37);
          local_108 = auVar30._0_8_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_108 * local_108;
          auVar4 = vfmadd231sd_fma(auVar38,auVar6,auVar6);
          auVar4 = vfmadd231sd_fma(auVar4,auVar31,auVar31);
          auVar4 = vsqrtsd_avx(auVar4,auVar4);
          local_100 = 1.0 / auVar4._0_8_;
          local_110 = auVar6._0_8_ * local_100;
          local_108 = local_108 * local_100;
          local_100 = auVar31._0_8_ * local_100;
          if (local_188._M_current != iStack_180._M_current) {
            lVar28 = (long)iStack_180._M_current - (long)local_188._M_current;
            local_168._M_current = local_188._M_current;
            ::std::
            __introsort_loop<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                      (local_188,
                       (__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                        )iStack_180._M_current,(ulong)(uint)((int)LZCOUNT(lVar28 >> 4) * 2) ^ 0x7e,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                        )&local_f8);
            if (lVar28 < 0x101) {
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                        (local_168,
                         (__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                          )__last._M_current,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                          )&local_f8);
            }
            else {
              __last_00._M_current = local_168._M_current + 0x10;
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                        (local_168,__last_00,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                          )&local_f8);
              for (; __last_00._M_current != __last._M_current;
                  __last_00._M_current = __last_00._M_current + 1) {
                ::std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Val_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                          (__last_00,
                           (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                            )&local_f8);
              }
            }
          }
        }
        pEVar8 = local_130;
        pPVar21 = ((local_188._M_current)->
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  ).mesh;
        sVar18 = ((local_188._M_current)->
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 ).ind;
        if (pPVar21->useImplicitTwinFlag == true) {
          uVar10 = ~(uint)sVar18 & 1;
        }
        else {
          uVar10 = (uint)(pPVar21->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start[sVar18];
        }
        if (uVar10 != 0) {
          pPVar21 = local_e0.data.
                    super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                    .m_storage.m_data[sVar18].
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh;
          sVar18 = local_e0.data.
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[sVar18].
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        }
        if ((long)iStack_180._M_current - (long)local_188._M_current == 0) {
LAB_001aa65b:
          operator_delete(local_188._M_current);
        }
        else {
          uVar14 = (long)iStack_180._M_current - (long)local_188._M_current >> 4;
          uVar29 = 0;
          do {
            uVar29 = uVar29 + 1;
            uVar24 = 0;
            if (uVar29 != uVar14) {
              uVar24 = uVar29;
            }
            if (pPVar21->useImplicitTwinFlag == true) {
              uVar10 = ~(uint)sVar18 & 1;
            }
            else {
              uVar10 = (uint)(pPVar21->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start[sVar18];
            }
            pPVar17 = local_188._M_current[uVar24].
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh;
            sVar20 = local_188._M_current[uVar24].
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind;
            if (pPVar17->useImplicitTwinFlag == true) {
              uVar23 = ~(uint)sVar20 & 1;
            }
            else {
              uVar23 = (uint)(pPVar17->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start[sVar20];
            }
            if ((uVar23 != 0) == (uVar10 != 0)) {
              pPVar17 = local_e0.data.
                        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                        .m_storage.m_data[sVar20].
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .mesh;
              sVar20 = local_e0.data.
                       super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                       .m_storage.m_data[sVar20].
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind;
            }
            heA.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = sVar18;
            heA.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh = pPVar21;
            heB.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = sVar20;
            heB.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh = pPVar17;
            EVar52 = SurfaceMesh::separateToNewEdge(mesh,heA,heB);
            local_68.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[EVar52.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                   .ind] = false;
            pdVar3 = (pEVar8->data).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            pdVar3[EVar52.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                   .ind] = pdVar3[sVar25];
            pPVar21 = local_e0.data.
                      super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                      .m_storage.m_data[sVar20].
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh;
            sVar18 = local_e0.data.
                     super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data[sVar20].
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind;
            uVar14 = (long)iStack_180._M_current - (long)local_188._M_current >> 4;
          } while (uVar29 < uVar14);
          if (local_188._M_current != (Halfedge *)0x0) goto LAB_001aa65b;
        }
        bVar9 = mesh->useImplicitTwinFlag;
        sVar18 = local_138;
      }
      puVar13 = (mesh->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + sVar25 + 1;
      puVar19 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start + sVar25 * 2 + 2;
      do {
        if (sVar1 == sVar25) goto LAB_001aa0e1;
        puVar22 = puVar13;
        if ((bVar9 & 1) != 0) {
          puVar22 = puVar19;
        }
        puVar13 = puVar13 + 1;
        puVar19 = puVar19 + 2;
        sVar25 = sVar25 + 1;
      } while (*puVar22 == 0xffffffffffffffff);
    } while (sVar18 != sVar25);
  }
LAB_001aa0e1:
  MeshData<geometrycentral::surface::Edge,_bool>::~MeshData(&local_68);
  MeshData<geometrycentral::surface::Face,_bool>::~MeshData(&local_a0);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::~MeshData
            (&local_e0);
  return;
}

Assistant:

void buildIntrinsicTuftedCover(SurfaceMesh& mesh, EdgeData<double>& edgeLengths, EmbeddedGeometryInterface* posGeom) {

  if (posGeom) {
    posGeom->requireVertexPositions();
    posGeom->requireFaceNormals();
  }

  // == Transform the connectivity of the input in to that of the tufted cover

  // Create two copies of each input face
  HalfedgeData<Halfedge> otherSheet(mesh);
  FaceData<bool> isFront(mesh, true); // original copy serves as front
  for (Face fFront : mesh.faces()) {
    if (!isFront[fFront]) continue; // only process original faces

    // create the new face, orient it in the opposite direction
    Face fBack = mesh.duplicateFace(fFront);

    // read off the correspondence bewteen the halfedges, before inverting
    Halfedge heF = fFront.halfedge();
    Halfedge heB = fBack.halfedge();
    do {
      otherSheet[heF] = heB;
      otherSheet[heB] = heF;
      heF = heF.next();
      heB = heB.next();
    } while (heF != fFront.halfedge());

    mesh.invertOrientation(fBack);

    isFront[fBack] = false;
  }


  // Around each edge, glue back faces to front along newly created edges
  EdgeData<bool> isOrigEdge(mesh, true);
  for (Edge e : mesh.edges()) {
    if (!isOrigEdge[e]) continue;

    // Gather the original faces incident on the edge (represented by the halfedge along the edge)
    std::vector<Halfedge> edgeFaces;
    for (Halfedge he : e.adjacentHalfedges()) {
      if (isFront[he.face()]) edgeFaces.push_back(he);
    }

    // If we have normals, use them for an angular sort.
    // Otherwise, just use the "natural" (arbitrary) ordering
    if (posGeom) {

      Vector3 pTail = posGeom->vertexPositions[e.halfedge().tailVertex()];
      Vector3 pTip = posGeom->vertexPositions[e.halfedge().tipVertex()];
      Vector3 edgeVec = pTip - pTail;
      std::array<Vector3, 2> eBasis = edgeVec.buildTangentBasis();

      auto edgeAngle = [&](const Halfedge& he) {
        Vector3 oppVert = posGeom->vertexPositions[he.next().tipVertex()];
        Vector3 outVec = unit(oppVert - pTail);
        return ::std::atan2(dot(std::get<1>(eBasis), outVec), dot(std::get<0>(eBasis), outVec));
      };
      auto sortFunc = [&](const Halfedge& heA, const Halfedge& heB) -> bool { return edgeAngle(heA) > edgeAngle(heB); };

      std::sort(edgeFaces.begin(), edgeFaces.end(), sortFunc);
    }


    // Sequentially connect the faces
    Halfedge currHe = edgeFaces.front();
    if (currHe.orientation()) currHe = otherSheet[currHe];
    for (size_t i = 0; i < edgeFaces.size(); i++) {
      Halfedge nextHe = edgeFaces[(i + 1) % edgeFaces.size()];
      if (currHe.orientation() == nextHe.orientation()) nextHe = otherSheet[nextHe];
      Edge newE = mesh.separateToNewEdge(currHe, nextHe);
      isOrigEdge[newE] = false;
      edgeLengths[newE] = edgeLengths[e];
      currHe = otherSheet[nextHe];
    }
  }

  // sanity checks
  // if (mesh.hasBoundary()) throw std::runtime_error("has boundary");
  // if (!mesh.isEdgeManifold()) throw std::runtime_error("not edge manifold");
  // if (!mesh.isOriented()) throw std::runtime_error("not oriented");
}